

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_variables.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBVariablesInit(ClientContext *context,TableFunctionInitInput *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Value *this;
  _Head_base<0UL,_duckdb::DuckDBVariablesData_*,_false> _Var2;
  ClientConfig *pCVar3;
  pointer pDVar4;
  _Hash_node_base *p_Var5;
  VariableData data;
  _Head_base<0UL,_duckdb::DuckDBVariablesData_*,_false> local_b8;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_b0;
  VariableData local_a8;
  LogicalType local_48;
  
  _Var2._M_head_impl = (DuckDBVariablesData *)operator_new(0x28);
  ((_Var2._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckDBVariablesData_01983c08;
  ((_Var2._M_head_impl)->variables).
  super_vector<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>.
  super__Vector_base<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((_Var2._M_head_impl)->variables).
  super_vector<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>.
  super__Vector_base<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var2._M_head_impl)->variables).
  super_vector<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>.
  super__Vector_base<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_Var2._M_head_impl)->offset = 0;
  local_b8._M_head_impl = _Var2._M_head_impl;
  pCVar3 = ClientConfig::GetConfig((ClientContext *)input);
  p_Var5 = (pCVar3->user_variables)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    paVar1 = &local_a8.name.field_2;
    this = &local_a8.value;
    local_b0._M_head_impl = (GlobalTableFunctionState *)context;
    do {
      local_a8.name._M_string_length = 0;
      local_a8.name.field_2._M_local_buf[0] = '\0';
      local_a8.name._M_dataplus._M_p = (pointer)paVar1;
      LogicalType::LogicalType(&local_48,SQLNULL);
      Value::Value(this,&local_48);
      LogicalType::~LogicalType(&local_48);
      ::std::__cxx11::string::_M_assign((string *)&local_a8);
      Value::operator=(this,(Value *)(p_Var5 + 5));
      pDVar4 = unique_ptr<duckdb::DuckDBVariablesData,_std::default_delete<duckdb::DuckDBVariablesData>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBVariablesData,_std::default_delete<duckdb::DuckDBVariablesData>,_true>
                             *)&local_b8);
      ::std::vector<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>::
      emplace_back<duckdb::VariableData>
                (&(pDVar4->variables).
                  super_vector<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>,
                 &local_a8);
      Value::~Value(this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8.name._M_dataplus._M_p);
      }
      p_Var5 = p_Var5->_M_nxt;
      context = (ClientContext *)local_b0._M_head_impl;
      _Var2._M_head_impl = local_b8._M_head_impl;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  *(DuckDBVariablesData **)context = _Var2._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBVariablesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBVariablesData>();
	auto &config = ClientConfig::GetConfig(context);

	for (auto &entry : config.user_variables) {
		VariableData data;
		data.name = entry.first;
		data.value = entry.second;
		result->variables.push_back(std::move(data));
	}
	return std::move(result);
}